

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void tplt_print(FILE *out,lemon *lemp,char *str,int *lineno)

{
  int *lineno_local;
  char *str_local;
  lemon *lemp_local;
  FILE *out_local;
  
  lineno_local = (int *)str;
  if (str != (char *)0x0) {
    for (; (char)*lineno_local != '\0'; lineno_local = (int *)((long)lineno_local + 1)) {
      putc((int)(char)*lineno_local,(FILE *)out);
      if ((char)*lineno_local == '\n') {
        *lineno = *lineno + 1;
      }
    }
    if (*(char *)((long)lineno_local + -1) != '\n') {
      putc(10,(FILE *)out);
      *lineno = *lineno + 1;
    }
    if (lemp->nolinenosflag == 0) {
      *lineno = *lineno + 1;
      tplt_linedir(out,*lineno,lemp->outname);
    }
  }
  return;
}

Assistant:

PRIVATE void tplt_print(FILE *out, struct lemon *lemp, char *str, int *lineno)
{
  if( str==0 ) return;
  while( *str ){
    putc(*str,out);
    if( *str=='\n' ) (*lineno)++;
    str++;
  }
  if( str[-1]!='\n' ){
    putc('\n',out);
    (*lineno)++;
  }
  if (!lemp->nolinenosflag) {
    (*lineno)++; tplt_linedir(out,*lineno,lemp->outname);
  }
  return;
}